

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O0

void __thiscall
glu::TextureCube::loadCompressed
          (TextureCube *this,int numLevels,CompressedTexture *levels,
          TexDecompressionParams *decompressionParams)

{
  code *pcVar1;
  int iVar2;
  CompressedTexFormat format;
  deUint32 dVar3;
  deBool dVar4;
  int iVar5;
  deUint32 dVar6;
  int iVar7;
  undefined4 extraout_var;
  TestError *pTVar9;
  PixelBufferAccess *pPVar10;
  void *pvVar11;
  undefined1 local_80 [8];
  PixelBufferAccess refLevelAccess;
  CompressedTexture *level;
  int local_48;
  int face;
  int levelNdx;
  deUint32 compressedFormat;
  Functions *gl;
  TexDecompressionParams *decompressionParams_local;
  CompressedTexture *levels_local;
  int numLevels_local;
  TextureCube *this_local;
  long lVar8;
  
  iVar2 = (*this->m_context->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar2);
  format = tcu::CompressedTexture::getFormat(levels);
  dVar3 = getGLFormat(format);
  do {
    dVar4 = ::deGetFalse();
    if ((dVar4 != 0) || (this->m_glTexture == 0)) {
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,(char *)0x0,"m_glTexture",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0x19e);
      __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  (**(code **)(lVar8 + 0xb8))(0x8513,this->m_glTexture);
  local_48 = 0;
  do {
    if (numLevels <= local_48) {
      dVar3 = (**(code **)(lVar8 + 0x800))();
      checkError(dVar3,"Texture upload failed",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0x1b4);
      return;
    }
    for (level._4_4_ = CUBEFACE_NEGATIVE_X; (int)level._4_4_ < 6;
        level._4_4_ = level._4_4_ + CUBEFACE_POSITIVE_X) {
      refLevelAccess.super_ConstPixelBufferAccess.m_data =
           levels + (int)(local_48 * 6 + level._4_4_);
      tcu::TextureCube::allocLevel(&this->m_refTexture,level._4_4_,local_48);
      pPVar10 = tcu::TextureCube::getLevelFace(&this->m_refTexture,local_48,level._4_4_);
      tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_80,pPVar10);
      do {
        dVar4 = ::deGetFalse();
        if (dVar4 != 0) {
LAB_00880ff3:
          pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar9,(char *)0x0,
                     "level.getWidth() == refLevelAccess.getWidth() && level.getHeight() == refLevelAccess.getHeight()"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                     ,0x1ab);
          __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        iVar2 = tcu::CompressedTexture::getWidth
                          ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
        iVar5 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_80);
        if (iVar2 != iVar5) goto LAB_00880ff3;
        iVar2 = tcu::CompressedTexture::getHeight
                          ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
        iVar5 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)local_80);
        if (iVar2 != iVar5) goto LAB_00880ff3;
        dVar4 = ::deGetFalse();
      } while (dVar4 != 0);
      tcu::CompressedTexture::decompress
                ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data,
                 (PixelBufferAccess *)local_80,decompressionParams);
      pcVar1 = *(code **)(lVar8 + 0x288);
      dVar6 = getGLCubeFace(level._4_4_);
      iVar2 = tcu::CompressedTexture::getWidth
                        ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
      iVar5 = tcu::CompressedTexture::getHeight
                        ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
      iVar7 = tcu::CompressedTexture::getDataSize
                        ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
      pvVar11 = tcu::CompressedTexture::getData
                          ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
      (*pcVar1)(dVar6,local_48,dVar3,iVar2,iVar5,0,iVar7,pvVar11);
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

void TextureCube::loadCompressed (int numLevels, const tcu::CompressedTexture* levels, const tcu::TexDecompressionParams& decompressionParams)
{
	const glw::Functions&	gl					= m_context.getFunctions();
	deUint32				compressedFormat	= getGLFormat(levels[0].getFormat());

	TCU_CHECK(m_glTexture);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_glTexture);

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			const tcu::CompressedTexture& level = levels[levelNdx*tcu::CUBEFACE_LAST + face];

			// Decompress to reference texture.
			m_refTexture.allocLevel((tcu::CubeFace)face, levelNdx);
			tcu::PixelBufferAccess refLevelAccess = m_refTexture.getLevelFace(levelNdx, (tcu::CubeFace)face);
			TCU_CHECK(level.getWidth()	== refLevelAccess.getWidth() &&
					  level.getHeight()	== refLevelAccess.getHeight());
			level.decompress(refLevelAccess, decompressionParams);

			// Upload to GL texture in compressed form.
			gl.compressedTexImage2D(getGLCubeFace((tcu::CubeFace)face), levelNdx, compressedFormat,
									level.getWidth(), level.getHeight(), 0 /* border */, level.getDataSize(), level.getData());
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");
}